

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::AbsorbIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,Iterator *iter,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc)

{
  Edge *edge_00;
  int shape_id;
  uint uVar1;
  ulong uVar2;
  pointer ppCVar3;
  pointer pFVar4;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> _Var5;
  FaceEdge *pFVar6;
  bool bVar7;
  int iVar8;
  const_reference pvVar9;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar10;
  pointer ppCVar11;
  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
  __last;
  __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_**,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
  __first;
  MutableS2ShapeIndex *this_01;
  FaceEdge *pFVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range2;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  new_edges;
  pointer puStack_e0;
  CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>_conflict
  local_d8;
  node_type *pnStack_d0;
  ClippedEdge *clipped;
  unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  local_a8;
  ulong local_a0;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_> *local_98;
  FaceEdge edge;
  
  uVar13 = (pcell->id_).id_;
  if (uVar13 != (iter->super_IteratorBase).id_.id_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&edge,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x4e7,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)CONCAT44(edge._12_4_,edge.max_level),
                    "Check failed: (pcell.id()) == (iter.id()) ");
LAB_001dc725:
    abort();
  }
  if (((tracker->is_active_ == true) &&
      (ppCVar11 = (edges->
                  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      ppCVar11 !=
      (edges->
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      )._M_impl.super__Vector_impl_data._M_finish)) &&
     ((*ppCVar11)->face_edge->shape_id < this->pending_additions_begin_)) {
    if (uVar13 - (~uVar13 & uVar13 - 1) != (tracker->next_cellid_).id_) {
      S2PaddedCell::GetEntryVertex((S2Point *)&edge,pcell);
      (tracker->b_).c_[2] = edge.a.c_[0];
      (tracker->b_).c_[0] = (VType)edge._0_8_;
      (tracker->b_).c_[1] = (VType)CONCAT44(edge._12_4_,edge.max_level);
    }
    S2PaddedCell::GetExitVertex((S2Point *)&edge,pcell);
    InteriorTracker::DrawTo(tracker,(S2Point *)&edge);
    uVar2 = (pcell->id_).id_;
    uVar13 = uVar2 + (-uVar2 & uVar2) * 2;
    (tracker->next_cellid_).id_ = uVar13 - (~uVar13 & (uVar2 + (-uVar2 & uVar2) * 2) - 1);
    ppCVar3 = (edges->
              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar11 = (edges->
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar3;
        ppCVar11 = ppCVar11 + 1) {
      pFVar12 = (*ppCVar11)->face_edge;
      if (this->pending_additions_begin_ <= pFVar12->shape_id) break;
      if (pFVar12->has_interior == true) {
        InteriorTracker::TestEdge(tracker,pFVar12->shape_id,&pFVar12->edge);
      }
    }
  }
  InteriorTracker::SaveAndClearStateBefore(tracker,this->pending_additions_begin_);
  pFVar4 = (alloc->face_edges_).
           super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((alloc->face_edges_).
      super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar4) {
    (alloc->face_edges_).
    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
  }
  local_98 = &alloc->face_edges_;
  this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
            (iter->super_IteratorBase).cell_._M_b._M_p;
  local_a8._M_t.
  super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl =
       (__uniq_ptr_data<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>,_true,_true>
        )&tracker->b_;
  edge_00 = &edge.edge;
  bVar15 = false;
  for (uVar13 = 0; (uint)uVar13 < (*(uint *)&this_00->field_0x0 & 0xffffff);
      uVar13 = (ulong)((int)uVar13 + 1)) {
    pvVar9 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       (this_00,(uint)uVar13);
    shape_id = pvVar9->shape_id_;
    _Var5._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
    super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
         (this->shapes_).
         super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[shape_id]._M_t.
         super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
    if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
        _Var5._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
        super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
      uVar1 = *(uint *)&pvVar9->field_0x4;
      edge.edge.v1.c_[1] = 0.0;
      edge.edge.v1.c_[2] = 0.0;
      edge.edge.v0.c_[2] = 0.0;
      edge.edge.v1.c_[0] = 0.0;
      edge.edge.v0.c_[0] = 0.0;
      edge.edge.v0.c_[1] = 0.0;
      edge.b.c_[0] = 0.0;
      edge.b.c_[1] = 0.0;
      edge.a.c_[0] = 0.0;
      edge.a.c_[1] = 0.0;
      edge.shape_id =
           *(int32 *)((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                            super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8);
      local_a0 = uVar13;
      iVar8 = (**(code **)(*(long *)_Var5._M_t.
                                    super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                    .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x20))
                        (_Var5._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                         .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
      edge.has_interior = iVar8 == 2;
      if ((iVar8 == 2) &&
         (InteriorTracker::AddShape
                    (tracker,shape_id,(bool)((byte)*(undefined4 *)&pvVar9->field_0x4 & 1)),
         1 < uVar1 && !bVar15)) {
        S2PaddedCell::GetCenter((S2Point *)&new_edges,pcell);
        *(pointer *)
         ((long)local_a8._M_t.
                super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                ._M_t.
                super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl +
         0x10) = new_edges.
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(pointer *)
         local_a8._M_t.
         super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
         ._M_t.
         super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
         .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl =
             new_edges.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)local_a8._M_t.
                super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                ._M_t.
                super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl + 8)
             = new_edges.
               super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        S2PaddedCell::GetEntryVertex((S2Point *)&new_edges,pcell);
        InteriorTracker::DrawTo(tracker,(S2Point *)&new_edges);
        uVar13 = (pcell->id_).id_;
        (tracker->next_cellid_).id_ = uVar13 - (~uVar13 & uVar13 - 1);
        bVar15 = true;
      }
      for (lVar14 = 0; uVar13 = local_a0, (ulong)(uVar1 >> 1) << 2 != lVar14; lVar14 = lVar14 + 4) {
        paVar10 = &pvVar9->field_3;
        if (5 < *(uint *)&pvVar9->field_0x4) {
          paVar10 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar9->field_3).edges_;
        }
        edge.edge_id = *(int32 *)((long)paVar10 + lVar14);
        this_01 = (MutableS2ShapeIndex *)&new_edges;
        (**(code **)(*(long *)_Var5._M_t.
                              super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x18))
                  (this_01,_Var5._M_t.
                           super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                           super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
        edge.edge.v1.c_[1] =
             (VType)local_d8.
                    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                    .
                    super_Storage<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_2UL,_false>
                    .value;
        edge.edge.v1.c_[2] = (VType)pnStack_d0;
        edge.edge.v0.c_[2] =
             (VType)new_edges.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        edge.edge.v1.c_[0] = (VType)puStack_e0;
        edge.edge.v0.c_[0] =
             (VType)new_edges.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        edge.edge.v0.c_[1] =
             (VType)new_edges.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        edge.max_level = GetEdgeMaxLevel(this_01,edge_00);
        if (edge.has_interior == true) {
          InteriorTracker::TestEdge(tracker,shape_id,edge_00);
        }
        bVar7 = S2::ClipToPaddedFace
                          (&edge_00->v0,&edge.edge.v1,(uint)((pcell->id_).id_ >> 0x3d),kCellPadding,
                           &edge.a,&edge.b);
        if (!bVar7) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&new_edges,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                     ,0x536,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)
                          new_edges.
                          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          "Invariant failure in MutableS2ShapeIndex");
          goto LAB_001dc725;
        }
        std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
        push_back(local_98,&edge);
      }
    }
  }
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar6 = (alloc->face_edges_).
           super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar12 = (alloc->face_edges_).
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 ._M_impl.super__Vector_impl_data._M_start; pFVar12 != pFVar6; pFVar12 = pFVar12 + 1
      ) {
    clipped = EdgeAllocator::NewClippedEdge(alloc);
    clipped->face_edge = pFVar12;
    S2::GetClippedEdgeBound((R2Rect *)&edge,&pFVar12->a,&pFVar12->b,&pcell->bound_);
    (clipped->bound).bounds_[1].bounds_.c_[0] = edge.a.c_[0];
    (clipped->bound).bounds_[1].bounds_.c_[1] = edge.a.c_[1];
    (clipped->bound).bounds_[0].bounds_.c_[0] = (VType)edge._0_8_;
    (clipped->bound).bounds_[0].bounds_.c_[1] = (VType)CONCAT44(edge._12_4_,edge.max_level);
    std::
    vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ::push_back(&new_edges,&clipped);
  }
  ppCVar11 = (edges->
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)__last._M_current - (long)ppCVar11 >> 3;
  __first._M_current = ppCVar11 + -1;
  do {
    bVar15 = lVar14 == 0;
    lVar14 = lVar14 + -1;
    if (bVar15) goto LAB_001dc644;
    ppCVar3 = __first._M_current + 1;
    __first._M_current = __first._M_current + 1;
  } while ((*ppCVar3)->face_edge->shape_id < this->pending_additions_begin_);
  std::
  vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<MutableS2ShapeIndex::ClippedEdge_const**,std::vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>>,void>
            ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
              *)&new_edges,
             (const_iterator)
             new_edges.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,__first,__last);
  ppCVar11 = (edges->
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_001dc644:
  ppCVar3 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_start =
       new_edges.
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       new_edges.
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (edges->
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       new_edges.
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  edge._0_8_ = (pcell->id_).id_;
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppCVar11;
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __last._M_current;
  new_edges.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar3;
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  ::erase_unique<S2CellId>
            ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)&this->cell_map_,(S2CellId *)&edge);
  S2ShapeIndexCell::~S2ShapeIndexCell((S2ShapeIndexCell *)this_00);
  operator_delete(this_00);
  std::
  _Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::~_Vector_base(&new_edges.
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 );
  return;
}

Assistant:

void MutableS2ShapeIndex::AbsorbIndexCell(const S2PaddedCell& pcell,
                                          const Iterator& iter,
                                          vector<const ClippedEdge*>* edges,
                                          InteriorTracker* tracker,
                                          EdgeAllocator* alloc) {
  S2_DCHECK_EQ(pcell.id(), iter.id());

  // When we absorb a cell, we erase all the edges that are being removed.
  // However when we are finished with this cell, we want to restore the state
  // of those edges (since that is how we find all the index cells that need
  // to be updated).  The edges themselves are restored automatically when
  // UpdateEdges returns from its recursive call, but the InteriorTracker
  // state needs to be restored explicitly.
  //
  // Here we first update the InteriorTracker state for removed edges to
  // correspond to the exit vertex of this cell, and then save the
  // InteriorTracker state.  This state will be restored by UpdateEdges when
  // it is finished processing the contents of this cell.
  if (tracker->is_active() && !edges->empty() &&
      is_shape_being_removed((*edges)[0]->face_edge->shape_id)) {
    // We probably need to update the InteriorTracker.  ("Probably" because
    // it's possible that all shapes being removed do not have interiors.)
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetExitVertex());
    tracker->set_next_cellid(pcell.id().next());
    for (const ClippedEdge* edge : *edges) {
      const FaceEdge* face_edge = edge->face_edge;
      if (!is_shape_being_removed(face_edge->shape_id)) {
        break;  // All shapes being removed come first.
      }
      if (face_edge->has_interior) {
        tracker->TestEdge(face_edge->shape_id, face_edge->edge);
      }
    }
  }
  // Save the state of the edges being removed, so that it can be restored
  // when we are finished processing this cell and its children.  We don't
  // need to save the state of the edges being added because they aren't being
  // removed from "edges" and will therefore be updated normally as we visit
  // this cell and its children.
  tracker->SaveAndClearStateBefore(pending_additions_begin_);

  // Create a FaceEdge for each edge in this cell that isn't being removed.
  vector<FaceEdge>* face_edges = alloc->mutable_face_edges();
  face_edges->clear();
  bool tracker_moved = false;
  const S2ShapeIndexCell& cell = iter.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int shape_id = clipped.shape_id();
    const S2Shape* shape = this->shape(shape_id);
    if (shape == nullptr) continue;  // This shape is being removed.
    int num_edges = clipped.num_edges();

    // If this shape has an interior, start tracking whether we are inside the
    // shape.  UpdateEdges() wants to know whether the entry vertex of this
    // cell is inside the shape, but we only know whether the center of the
    // cell is inside the shape, so we need to test all the edges against the
    // line segment from the cell center to the entry vertex.
    FaceEdge edge;
    edge.shape_id = shape->id();
    edge.has_interior = (shape->dimension() == 2);
    if (edge.has_interior) {
      tracker->AddShape(shape_id, clipped.contains_center());
      // There might not be any edges in this entire cell (i.e., it might be
      // in the interior of all shapes), so we delay updating the tracker
      // until we see the first edge.
      if (!tracker_moved && num_edges > 0) {
        tracker->MoveTo(pcell.GetCenter());
        tracker->DrawTo(pcell.GetEntryVertex());
        tracker->set_next_cellid(pcell.id());
        tracker_moved = true;
      }
    }
    for (int i = 0; i < num_edges; ++i) {
      int e = clipped.edge(i);
      edge.edge_id = e;
      edge.edge = shape->edge(e);
      edge.max_level = GetEdgeMaxLevel(edge.edge);
      if (edge.has_interior) tracker->TestEdge(shape_id, edge.edge);
      if (!S2::ClipToPaddedFace(edge.edge.v0, edge.edge.v1, pcell.id().face(),
                                kCellPadding, &edge.a, &edge.b)) {
        S2_LOG(DFATAL) << "Invariant failure in MutableS2ShapeIndex";
      }
      face_edges->push_back(edge);
    }
  }
  // Now create a ClippedEdge for each FaceEdge, and put them in "new_edges".
  vector<const ClippedEdge*> new_edges;
  for (const FaceEdge& face_edge : *face_edges) {
    ClippedEdge* clipped = alloc->NewClippedEdge();
    clipped->face_edge = &face_edge;
    clipped->bound = S2::GetClippedEdgeBound(face_edge.a, face_edge.b,
                                                     pcell.bound());
    new_edges.push_back(clipped);
  }
  // Discard any edges from "edges" that are being removed, and append the
  // remainder to "new_edges".  (This keeps the edges sorted by shape id.)
  for (int i = 0; i < edges->size(); ++i) {
    const ClippedEdge* clipped = (*edges)[i];
    if (!is_shape_being_removed(clipped->face_edge->shape_id)) {
      new_edges.insert(new_edges.end(), edges->begin() + i, edges->end());
      break;
    }
  }
  // Update the edge list and delete this cell from the index.
  edges->swap(new_edges);
  cell_map_.erase(pcell.id());
  delete &cell;
}